

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_emr_describe_execute_plan.cc
# Opt level: O2

int __thiscall
aliyun::Emr::DescribeExecutePlan
          (Emr *this,EmrDescribeExecutePlanRequestType *req,
          EmrDescribeExecutePlanResponseType *response,EmrErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  Int IVar3;
  ArrayIndex AVar4;
  AliRpcRequest *this_00;
  Value *pVVar5;
  Value *pVVar6;
  Value *pVVar7;
  int i;
  uint uVar8;
  char *pcVar9;
  Value val;
  allocator<char> local_49c;
  allocator<char> local_49b;
  allocator<char> local_49a;
  allocator<char> local_499;
  Value *local_498;
  uint local_48c;
  undefined1 local_488 [32];
  _Alloc_hider local_468;
  size_type local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  _Alloc_hider local_448;
  size_type local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  _Alloc_hider local_428;
  size_type local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  _Alloc_hider local_408;
  size_type local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  Int local_3e8;
  Int local_3e4;
  _Alloc_hider local_3e0;
  size_type local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  _Alloc_hider local_3c0;
  size_type local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  _Alloc_hider local_3a0;
  size_type local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  undefined1 local_380 [32];
  _Alloc_hider local_360;
  size_type local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  _Alloc_hider local_340;
  size_type local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  _Alloc_hider local_320;
  size_type local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  string str_response;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string secheme;
  string local_160;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar9 = "http";
  if (this->use_tls_ != false) {
    pcVar9 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar9,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->version_,(allocator<char> *)local_488);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->appid_,(allocator<char> *)local_380);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,this->secret_,(allocator<char> *)&local_160);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_200,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_1a0,&local_1c0,&local_1e0,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  if (((this->use_tls_ == false) && (pcVar9 = this->proxy_host_, pcVar9 != (char *)0x0)) &&
     (*pcVar9 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,pcVar9,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"Action",(allocator<char> *)local_488);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"DescribeExecutePlan",(allocator<char> *)local_380);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  if ((req->id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"Id",(allocator<char> *)local_488);
    std::__cxx11::string::string((string *)&local_2a0,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_280);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,"RegionId",(allocator<char> *)local_488);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,this->region_id_,(allocator<char> *)local_380);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2c0);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (EmrErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_488,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_488,anon_var_dwarf_13598b + 9,&local_499);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_488);
        std::__cxx11::string::~string((string *)local_488);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_488,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_488,anon_var_dwarf_13598b + 9,&local_49a);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_488);
        std::__cxx11::string::~string((string *)local_488);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_488,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_488,anon_var_dwarf_13598b + 9,&local_49b);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_488);
        std::__cxx11::string::~string((string *)local_488);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_488,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_488,anon_var_dwarf_13598b + 9,&local_49c);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_488);
        std::__cxx11::string::~string((string *)local_488);
      }
      if (response != (EmrDescribeExecutePlanResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"Id");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Id");
          IVar3 = Json::Value::asInt(pVVar5);
          response->id = (long)IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"Name");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Name");
          Json::Value::asString_abi_cxx11_((string *)local_488,pVVar5);
          std::__cxx11::string::operator=((string *)&response->name,(string *)local_488);
          std::__cxx11::string::~string((string *)local_488);
        }
        bVar1 = Json::Value::isMember(&val,"Strategy");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Strategy");
          IVar3 = Json::Value::asInt(pVVar5);
          response->strategy = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"TimeInterval");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"TimeInterval");
          IVar3 = Json::Value::asInt(pVVar5);
          response->time_interval = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"StartTime");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"StartTime");
          Json::Value::asString_abi_cxx11_((string *)local_488,pVVar5);
          std::__cxx11::string::operator=((string *)&response->start_time,(string *)local_488);
          std::__cxx11::string::~string((string *)local_488);
        }
        bVar1 = Json::Value::isMember(&val,"TimeUnit");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"TimeUnit");
          Json::Value::asString_abi_cxx11_((string *)local_488,pVVar5);
          std::__cxx11::string::operator=((string *)&response->time_unit,(string *)local_488);
          std::__cxx11::string::~string((string *)local_488);
        }
        bVar1 = Json::Value::isMember(&val,"IsCreateCluster");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"IsCreateCluster");
          bVar1 = Json::Value::asBool(pVVar5);
          response->is_create_cluster = bVar1;
        }
        bVar1 = Json::Value::isMember(&val,"JobInfos");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"JobInfos");
          bVar1 = Json::Value::isMember(pVVar5,"JobInfo");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](&val,"JobInfos");
            pVVar5 = Json::Value::operator[](pVVar5,"JobInfo");
            bVar1 = Json::Value::isArray(pVVar5);
            if (bVar1) {
              for (uVar8 = 0; AVar4 = Json::Value::size(pVVar5), uVar8 < AVar4; uVar8 = uVar8 + 1) {
                pVVar6 = Json::Value::operator[](pVVar5,uVar8);
                bVar1 = Json::Value::isMember(pVVar6,"Id");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar6,"Id");
                  IVar3 = Json::Value::asInt(pVVar6);
                  local_488._0_8_ = SEXT48(IVar3);
                }
                std::
                vector<aliyun::EmrDescribeExecutePlanJobInfoType,_std::allocator<aliyun::EmrDescribeExecutePlanJobInfoType>_>
                ::push_back(&response->job_infos,(value_type *)local_488);
              }
            }
          }
        }
        bVar1 = Json::Value::isMember(&val,"ClusterInfo");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"ClusterInfo");
          bVar1 = Json::Value::isMember(pVVar5,"ClusterId");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"ClusterId");
            IVar3 = Json::Value::asInt(pVVar6);
            (response->cluster_info).cluster_id = (long)IVar3;
          }
          bVar1 = Json::Value::isMember(pVVar5,"BizId");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"BizId");
            Json::Value::asString_abi_cxx11_((string *)local_488,pVVar6);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).biz_id,(string *)local_488);
            std::__cxx11::string::~string((string *)local_488);
          }
          bVar1 = Json::Value::isMember(pVVar5,"ClusterName");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"ClusterName");
            Json::Value::asString_abi_cxx11_((string *)local_488,pVVar6);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).cluster_name,(string *)local_488);
            std::__cxx11::string::~string((string *)local_488);
          }
          bVar1 = Json::Value::isMember(pVVar5,"UtcStartTime");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"UtcStartTime");
            Json::Value::asString_abi_cxx11_((string *)local_488,pVVar6);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).utc_start_time,(string *)local_488);
            std::__cxx11::string::~string((string *)local_488);
          }
          bVar1 = Json::Value::isMember(pVVar5,"UtcStopTime");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"UtcStopTime");
            Json::Value::asString_abi_cxx11_((string *)local_488,pVVar6);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).utc_stop_time,(string *)local_488);
            std::__cxx11::string::~string((string *)local_488);
          }
          bVar1 = Json::Value::isMember(pVVar5,"TimeOutEnable");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"TimeOutEnable");
            IVar3 = Json::Value::asInt(pVVar6);
            (response->cluster_info).time_out_enable = IVar3;
          }
          bVar1 = Json::Value::isMember(pVVar5,"TimeOutTime");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"TimeOutTime");
            Json::Value::asString_abi_cxx11_((string *)local_488,pVVar6);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).time_out_time,(string *)local_488);
            std::__cxx11::string::~string((string *)local_488);
          }
          bVar1 = Json::Value::isMember(pVVar5,"TimeOutWarningWay");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"TimeOutWarningWay");
            IVar3 = Json::Value::asInt(pVVar6);
            (response->cluster_info).time_out_warning_way = IVar3;
          }
          bVar1 = Json::Value::isMember(pVVar5,"TimeOutOperate");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"TimeOutOperate");
            IVar3 = Json::Value::asInt(pVVar6);
            (response->cluster_info).time_out_operate = IVar3;
          }
          bVar1 = Json::Value::isMember(pVVar5,"ReleaseSetting");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"ReleaseSetting");
            IVar3 = Json::Value::asInt(pVVar6);
            (response->cluster_info).release_setting = IVar3;
          }
          bVar1 = Json::Value::isMember(pVVar5,"IsOpenOssLog");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"IsOpenOssLog");
            bVar1 = Json::Value::asBool(pVVar6);
            (response->cluster_info).is_open_oss_log = bVar1;
          }
          bVar1 = Json::Value::isMember(pVVar5,"Status");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"Status");
            IVar3 = Json::Value::asInt(pVVar6);
            (response->cluster_info).status = IVar3;
          }
          bVar1 = Json::Value::isMember(pVVar5,"LastJobStatus");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"LastJobStatus");
            IVar3 = Json::Value::asInt(pVVar6);
            (response->cluster_info).last_job_status = IVar3;
          }
          bVar1 = Json::Value::isMember(pVVar5,"RunningTime");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"RunningTime");
            IVar3 = Json::Value::asInt(pVVar6);
            (response->cluster_info).running_time = IVar3;
          }
          bVar1 = Json::Value::isMember(pVVar5,"FailReason");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"FailReason");
            Json::Value::asString_abi_cxx11_((string *)local_488,pVVar6);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).fail_reason,(string *)local_488);
            std::__cxx11::string::~string((string *)local_488);
          }
          bVar1 = Json::Value::isMember(pVVar5,"OssPath");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"OssPath");
            Json::Value::asString_abi_cxx11_((string *)local_488,pVVar6);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).oss_path,(string *)local_488);
            std::__cxx11::string::~string((string *)local_488);
          }
          bVar1 = Json::Value::isMember(pVVar5,"EmrRole4ECS");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"EmrRole4ECS");
            Json::Value::asString_abi_cxx11_((string *)local_488,pVVar6);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).emr_role4_ec_s,(string *)local_488);
            std::__cxx11::string::~string((string *)local_488);
          }
          bVar1 = Json::Value::isMember(pVVar5,"EmrRole4Oss");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"EmrRole4Oss");
            Json::Value::asString_abi_cxx11_((string *)local_488,pVVar6);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).emr_role4_oss,(string *)local_488);
            std::__cxx11::string::~string((string *)local_488);
          }
          bVar1 = Json::Value::isMember(pVVar5,"IsOpenPublicIp");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](pVVar5,"IsOpenPublicIp");
            bVar1 = Json::Value::asBool(pVVar5);
            (response->cluster_info).is_open_public_ip = bVar1;
          }
        }
        bVar1 = Json::Value::isMember(&val,"SoftwareInfo");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"SoftwareInfo");
          bVar1 = Json::Value::isMember(pVVar5,"EmrVer");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"EmrVer");
            Json::Value::asString_abi_cxx11_((string *)local_488,pVVar6);
            std::__cxx11::string::operator=((string *)&response->software_info,(string *)local_488);
            std::__cxx11::string::~string((string *)local_488);
          }
          bVar1 = Json::Value::isMember(pVVar5,"ClusterType");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"ClusterType");
            Json::Value::asString_abi_cxx11_((string *)local_488,pVVar6);
            std::__cxx11::string::operator=
                      ((string *)&(response->software_info).cluster_type,(string *)local_488);
            std::__cxx11::string::~string((string *)local_488);
          }
          bVar1 = Json::Value::isMember(pVVar5,"Softwares");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](pVVar5,"Softwares");
            Json::Value::asString_abi_cxx11_((string *)local_488,pVVar5);
            std::__cxx11::string::operator=
                      ((string *)&(response->software_info).softwares,(string *)local_488);
            std::__cxx11::string::~string((string *)local_488);
          }
        }
        bVar1 = Json::Value::isMember(&val,"EcsInfo");
        iVar2 = 200;
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"EcsInfo");
          bVar1 = Json::Value::isMember(pVVar5,"RegionId");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"RegionId");
            Json::Value::asString_abi_cxx11_((string *)local_488,pVVar6);
            std::__cxx11::string::operator=
                      ((string *)&(response->ecs_info).region_id,(string *)local_488);
            std::__cxx11::string::~string((string *)local_488);
          }
          bVar1 = Json::Value::isMember(pVVar5,"ZoneId");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"ZoneId");
            Json::Value::asString_abi_cxx11_((string *)local_488,pVVar6);
            std::__cxx11::string::operator=
                      ((string *)&(response->ecs_info).zone_id,(string *)local_488);
            std::__cxx11::string::~string((string *)local_488);
          }
          bVar1 = Json::Value::isMember(pVVar5,"ImageId");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"ImageId");
            Json::Value::asString_abi_cxx11_((string *)local_488,pVVar6);
            std::__cxx11::string::operator=
                      ((string *)&(response->ecs_info).image_id,(string *)local_488);
            std::__cxx11::string::~string((string *)local_488);
          }
          bVar1 = Json::Value::isMember(pVVar5,"ImageName");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"ImageName");
            Json::Value::asString_abi_cxx11_((string *)local_488,pVVar6);
            std::__cxx11::string::operator=
                      ((string *)&(response->ecs_info).image_name,(string *)local_488);
            std::__cxx11::string::~string((string *)local_488);
          }
          bVar1 = Json::Value::isMember(pVVar5,"SparkVersion");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"SparkVersion");
            Json::Value::asString_abi_cxx11_((string *)local_488,pVVar6);
            std::__cxx11::string::operator=
                      ((string *)&(response->ecs_info).spark_version,(string *)local_488);
            std::__cxx11::string::~string((string *)local_488);
          }
          bVar1 = Json::Value::isMember(pVVar5,"SecurityGroupId");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"SecurityGroupId");
            Json::Value::asString_abi_cxx11_((string *)local_488,pVVar6);
            std::__cxx11::string::operator=
                      ((string *)&(response->ecs_info).security_group_id,(string *)local_488);
            std::__cxx11::string::~string((string *)local_488);
          }
          bVar1 = Json::Value::isMember(pVVar5,"TotalCount");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"TotalCount");
            IVar3 = Json::Value::asInt(pVVar6);
            (response->ecs_info).total_count = IVar3;
          }
          bVar1 = Json::Value::isMember(pVVar5,"MasterCount");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"MasterCount");
            IVar3 = Json::Value::asInt(pVVar6);
            (response->ecs_info).master_count = IVar3;
          }
          bVar1 = Json::Value::isMember(pVVar5,"SlaveCount");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"SlaveCount");
            IVar3 = Json::Value::asInt(pVVar6);
            (response->ecs_info).slave_count = IVar3;
          }
          bVar1 = Json::Value::isMember(pVVar5,"EcsRoles");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"EcsRoles");
            bVar1 = Json::Value::isMember(pVVar6,"EcsRole");
            if (bVar1) {
              pVVar5 = Json::Value::operator[](pVVar5,"EcsRoles");
              local_498 = Json::Value::operator[](pVVar5,"EcsRole");
              bVar1 = Json::Value::isArray(local_498);
              if (bVar1) {
                uVar8 = 0;
                while (AVar4 = Json::Value::size(local_498), uVar8 < AVar4) {
                  local_488._0_8_ = (pointer)0x0;
                  local_488._8_8_ = (pointer)0x0;
                  local_488._16_8_ = 0;
                  local_468._M_p = (pointer)&local_458;
                  local_460 = 0;
                  local_458._M_local_buf[0] = '\0';
                  local_448._M_p = (pointer)&local_438;
                  local_440 = 0;
                  local_438._M_local_buf[0] = '\0';
                  local_428._M_p = (pointer)&local_418;
                  local_420 = 0;
                  local_418._M_local_buf[0] = '\0';
                  local_408._M_p = (pointer)&local_3f8;
                  local_400 = 0;
                  local_3f8._M_local_buf[0] = '\0';
                  local_3e0._M_p = (pointer)&local_3d0;
                  local_3d8 = 0;
                  local_3d0._M_local_buf[0] = '\0';
                  local_3c0._M_p = (pointer)&local_3b0;
                  local_3b8 = 0;
                  local_3b0._M_local_buf[0] = '\0';
                  local_3a0._M_p = (pointer)&local_390;
                  local_398 = 0;
                  local_390._M_local_buf[0] = '\0';
                  local_48c = uVar8;
                  pVVar5 = Json::Value::operator[](local_498,uVar8);
                  bVar1 = Json::Value::isMember(pVVar5,"IsMaster");
                  if (bVar1) {
                    pVVar6 = Json::Value::operator[](pVVar5,"IsMaster");
                    local_488[0x18] = Json::Value::asBool(pVVar6);
                  }
                  bVar1 = Json::Value::isMember(pVVar5,"InstanceType");
                  if (bVar1) {
                    pVVar6 = Json::Value::operator[](pVVar5,"InstanceType");
                    Json::Value::asString_abi_cxx11_((string *)local_380,pVVar6);
                    std::__cxx11::string::operator=((string *)&local_468,(string *)local_380);
                    std::__cxx11::string::~string((string *)local_380);
                  }
                  bVar1 = Json::Value::isMember(pVVar5,"Payment");
                  if (bVar1) {
                    pVVar6 = Json::Value::operator[](pVVar5,"Payment");
                    Json::Value::asString_abi_cxx11_((string *)local_380,pVVar6);
                    std::__cxx11::string::operator=((string *)&local_448,(string *)local_380);
                    std::__cxx11::string::~string((string *)local_380);
                  }
                  bVar1 = Json::Value::isMember(pVVar5,"CpuCore");
                  if (bVar1) {
                    pVVar6 = Json::Value::operator[](pVVar5,"CpuCore");
                    Json::Value::asString_abi_cxx11_((string *)local_380,pVVar6);
                    std::__cxx11::string::operator=((string *)&local_428,(string *)local_380);
                    std::__cxx11::string::~string((string *)local_380);
                  }
                  bVar1 = Json::Value::isMember(pVVar5,"MemoryCapacity");
                  if (bVar1) {
                    pVVar6 = Json::Value::operator[](pVVar5,"MemoryCapacity");
                    Json::Value::asString_abi_cxx11_((string *)local_380,pVVar6);
                    std::__cxx11::string::operator=((string *)&local_408,(string *)local_380);
                    std::__cxx11::string::~string((string *)local_380);
                  }
                  bVar1 = Json::Value::isMember(pVVar5,"DiskType");
                  if (bVar1) {
                    pVVar6 = Json::Value::operator[](pVVar5,"DiskType");
                    local_3e8 = Json::Value::asInt(pVVar6);
                  }
                  bVar1 = Json::Value::isMember(pVVar5,"DiskCapacity");
                  if (bVar1) {
                    pVVar6 = Json::Value::operator[](pVVar5,"DiskCapacity");
                    local_3e4 = Json::Value::asInt(pVVar6);
                  }
                  bVar1 = Json::Value::isMember(pVVar5,"BandWidth");
                  if (bVar1) {
                    pVVar6 = Json::Value::operator[](pVVar5,"BandWidth");
                    Json::Value::asString_abi_cxx11_((string *)local_380,pVVar6);
                    std::__cxx11::string::operator=((string *)&local_3e0,(string *)local_380);
                    std::__cxx11::string::~string((string *)local_380);
                  }
                  bVar1 = Json::Value::isMember(pVVar5,"NetPayType");
                  if (bVar1) {
                    pVVar6 = Json::Value::operator[](pVVar5,"NetPayType");
                    Json::Value::asString_abi_cxx11_((string *)local_380,pVVar6);
                    std::__cxx11::string::operator=((string *)&local_3c0,(string *)local_380);
                    std::__cxx11::string::~string((string *)local_380);
                  }
                  bVar1 = Json::Value::isMember(pVVar5,"EcsPayType");
                  if (bVar1) {
                    pVVar6 = Json::Value::operator[](pVVar5,"EcsPayType");
                    Json::Value::asString_abi_cxx11_((string *)local_380,pVVar6);
                    std::__cxx11::string::operator=((string *)&local_3a0,(string *)local_380);
                    std::__cxx11::string::~string((string *)local_380);
                  }
                  bVar1 = Json::Value::isMember(pVVar5,"Nodes");
                  if (bVar1) {
                    pVVar6 = Json::Value::operator[](pVVar5,"Nodes");
                    bVar1 = Json::Value::isMember(pVVar6,"Node");
                    if (bVar1) {
                      pVVar5 = Json::Value::operator[](pVVar5,"Nodes");
                      pVVar5 = Json::Value::operator[](pVVar5,"Node");
                      bVar1 = Json::Value::isArray(pVVar5);
                      if (bVar1) {
                        for (uVar8 = 0; AVar4 = Json::Value::size(pVVar5), uVar8 < AVar4;
                            uVar8 = uVar8 + 1) {
                          local_380._0_8_ = local_380 + 0x10;
                          local_380._8_8_ = 0;
                          local_380[0x10] = '\0';
                          local_360._M_p = (pointer)&local_350;
                          local_358 = 0;
                          local_350._M_local_buf[0] = '\0';
                          local_340._M_p = (pointer)&local_330;
                          local_338 = 0;
                          local_330._M_local_buf[0] = '\0';
                          local_320._M_p = (pointer)&local_310;
                          local_318 = 0;
                          local_310._M_local_buf[0] = '\0';
                          pVVar6 = Json::Value::operator[](pVVar5,uVar8);
                          bVar1 = Json::Value::isMember(pVVar6,"InstanceId");
                          if (bVar1) {
                            pVVar7 = Json::Value::operator[](pVVar6,"InstanceId");
                            Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                            std::__cxx11::string::operator=
                                      ((string *)local_380,(string *)&local_160);
                            std::__cxx11::string::~string((string *)&local_160);
                          }
                          bVar1 = Json::Value::isMember(pVVar6,"PubIp");
                          if (bVar1) {
                            pVVar7 = Json::Value::operator[](pVVar6,"PubIp");
                            Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                            std::__cxx11::string::operator=
                                      ((string *)&local_360,(string *)&local_160);
                            std::__cxx11::string::~string((string *)&local_160);
                          }
                          bVar1 = Json::Value::isMember(pVVar6,"InnerIp");
                          if (bVar1) {
                            pVVar7 = Json::Value::operator[](pVVar6,"InnerIp");
                            Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                            std::__cxx11::string::operator=
                                      ((string *)&local_340,(string *)&local_160);
                            std::__cxx11::string::~string((string *)&local_160);
                          }
                          bVar1 = Json::Value::isMember(pVVar6,"DiskInfo");
                          if (bVar1) {
                            pVVar6 = Json::Value::operator[](pVVar6,"DiskInfo");
                            Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                            std::__cxx11::string::operator=
                                      ((string *)&local_320,(string *)&local_160);
                            std::__cxx11::string::~string((string *)&local_160);
                          }
                          std::
                          vector<aliyun::EmrDescribeExecutePlanNodeType,_std::allocator<aliyun::EmrDescribeExecutePlanNodeType>_>
                          ::push_back((vector<aliyun::EmrDescribeExecutePlanNodeType,_std::allocator<aliyun::EmrDescribeExecutePlanNodeType>_>
                                       *)local_488,(value_type *)local_380);
                          EmrDescribeExecutePlanNodeType::~EmrDescribeExecutePlanNodeType
                                    ((EmrDescribeExecutePlanNodeType *)local_380);
                        }
                      }
                    }
                  }
                  std::
                  vector<aliyun::EmrDescribeExecutePlanEcsRoleType,_std::allocator<aliyun::EmrDescribeExecutePlanEcsRoleType>_>
                  ::push_back(&(response->ecs_info).ecs_roles,(value_type *)local_488);
                  EmrDescribeExecutePlanEcsRoleType::~EmrDescribeExecutePlanEcsRoleType
                            ((EmrDescribeExecutePlanEcsRoleType *)local_488);
                  uVar8 = local_48c + 1;
                }
              }
            }
          }
        }
      }
      goto LAB_001395f9;
    }
  }
  iVar2 = -1;
  if (error_info != (EmrErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_001395f9:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Emr::DescribeExecutePlan(const EmrDescribeExecutePlanRequestType& req,
                      EmrDescribeExecutePlanResponseType* response,
                       EmrErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeExecutePlan");
  if(!req.id.empty()) {
    req_rpc->AddRequestQuery("Id", req.id);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}